

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O2

int get_device_perm_inner(perms_ *perms,char *path,uint *uid,uint *gid,mode_t *perm)

{
  char *__s2;
  int iVar1;
  size_t __n;
  unsigned_short *puVar2;
  
  puVar2 = &perms->prefix;
  while( true ) {
    __s2 = ((perms_ *)(puVar2 + -10))->name;
    if (__s2 == (char *)0x0) {
      return -1;
    }
    if (*puVar2 == 0) {
      iVar1 = strcmp(path,__s2);
    }
    else {
      __n = strlen(__s2);
      iVar1 = strncmp(path,__s2,__n);
    }
    if (iVar1 == 0) break;
    puVar2 = puVar2 + 0xc;
  }
  *uid = *(uint *)(puVar2 + -4);
  *gid = *(uint *)(puVar2 + -2);
  *perm = *(mode_t *)(puVar2 + -6);
  return 0;
}

Assistant:

static int get_device_perm_inner(struct perms_ *perms, const char *path,
                                    unsigned *uid, unsigned *gid, mode_t *perm)
{
    int i;
    for(i = 0; perms[i].name; i++) {

        if(perms[i].prefix) {
            if(strncmp(path, perms[i].name, strlen(perms[i].name)))
                continue;
        } else {
            if(strcmp(path, perms[i].name))
                continue;
        }
        *uid = perms[i].uid;
        *gid = perms[i].gid;
        *perm = perms[i].perm;
        return 0;
    }
    return -1;
}